

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O2

QString * wrapText(QString *__return_storage_ptr__,QString *names,int optionNameMaxWidth,
                  QString *description)

{
  int iVar1;
  char16_t cVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  long pos;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QStringBuilder<const_QLatin1String_&,_QString> local_b8;
  anon_class_24_3_3622c47a local_98;
  int nameIndex;
  QLatin1String local_78;
  char16_t nl;
  int optionNameMaxWidth_local;
  undefined1 local_60 [16];
  char16_t *local_50;
  char16_t *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.optionNameMaxWidth = &optionNameMaxWidth_local;
  nl = L'\n';
  local_78.m_size = 2;
  local_98.nameIndex = &nameIndex;
  nameIndex = 0;
  local_78.m_data = "  ";
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  lVar3 = (description->d).size;
  iVar6 = 0;
  pos = 0;
  lVar9 = 0;
  lVar8 = -1;
  local_98.names = names;
  optionNameMaxWidth_local = optionNameMaxWidth;
  do {
    if (lVar3 <= lVar9) {
      while ((long)nameIndex < (names->d).size) {
        wrapText::anon_class_24_3_3622c47a::operator()((QString *)&local_d8,&local_98);
        local_b8.b.d.size = local_d8.size;
        local_b8.b.d.ptr = local_d8.ptr;
        local_b8.b.d.d = local_d8.d;
        local_b8.a = &local_78;
        local_d8.d = (Data *)0x0;
        local_d8.ptr = (char16_t *)0x0;
        local_d8.size = 0;
        QStringBuilder<const_QLatin1String_&,_QString>::QStringBuilder
                  ((QStringBuilder<const_QLatin1String_&,_QString> *)local_60,&local_b8);
        local_40 = &nl;
        operator+=(__return_storage_ptr__,
                   (QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_const_char16_t_&>
                    *)local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_60 + 8));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    cVar2 = (description->d).ptr[lVar9];
    bVar4 = QChar::isSpace((uint)(ushort)cVar2);
    lVar5 = lVar9;
    if (!bVar4) {
      lVar5 = lVar8;
    }
    if ((iVar6 < 0x4c - optionNameMaxWidth) || (lVar7 = lVar5, lVar8 = lVar5, lVar5 == -1)) {
      iVar1 = iVar6 + 1;
      if ((iVar6 < 0x4b - optionNameMaxWidth || lVar5 != -1) && (lVar9 != lVar3 + -1)) {
        lVar7 = lVar9;
        iVar6 = iVar1;
        if (cVar2 == L'\n') goto LAB_00390b9c;
      }
      else {
        lVar7 = lVar9 + 1;
LAB_00390b9c:
        iVar6 = iVar1;
        lVar8 = lVar9;
        if (lVar7 != -1) goto LAB_00390ba6;
      }
    }
    else {
LAB_00390ba6:
      lVar9 = lVar8 + 1;
      wrapText::anon_class_24_3_3622c47a::operator()((QString *)&local_f0,&local_98);
      QString::leftJustified
                ((QString *)&local_d8,(QString *)&local_f0,(long)optionNameMaxWidth_local,
                 (QChar)0x20,false);
      local_b8.b.d.size = local_d8.size;
      local_b8.b.d.ptr = local_d8.ptr;
      local_b8.b.d.d = local_d8.d;
      local_b8.a = &local_78;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      QStringBuilder<const_QLatin1String_&,_QString>::QStringBuilder
                ((QStringBuilder<const_QLatin1String_&,_QString> *)local_60,&local_b8);
      local_40 = (char16_t *)CONCAT62(local_40._2_6_,0x20);
      operator+=(__return_storage_ptr__,
                 (QStringBuilder<QStringBuilder<const_QLatin1String_&,_QString>,_char16_t> *)
                 local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(local_60 + 8))
      ;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8.b.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
      local_b8.b.d.d = (Data *)(description->d).ptr;
      local_b8.a = (QLatin1String *)(description->d).size;
      local_60 = (undefined1  [16])QStringView::mid((QStringView *)&local_b8,pos,lVar7 - pos);
      local_50 = &nl;
      operator+=(__return_storage_ptr__,(QStringBuilder<QStringView,_const_char16_t_&> *)local_60);
      iVar6 = 0;
      if (lVar9 < lVar3) {
        bVar4 = QChar::isSpace((uint)(ushort)(description->d).ptr[lVar9]);
        lVar9 = (ulong)bVar4 + lVar9;
        lVar5 = -1;
        pos = lVar9;
      }
      else {
        lVar5 = -1;
        pos = lVar9;
      }
    }
    lVar9 = lVar9 + 1;
    lVar8 = lVar5;
  } while( true );
}

Assistant:

static QString wrapText(const QString &names, int optionNameMaxWidth, const QString &description)
{
    const auto nl = u'\n';
    const auto indentation = "  "_L1;

    // In case the list of option names is very long, wrap it as well
    int nameIndex = 0;
    auto nextNameSection = [&]() {
        QString section = names.mid(nameIndex, optionNameMaxWidth);
        nameIndex += section.size();
        return section;
    };

    QString text;
    qsizetype lineStart = 0;
    qsizetype lastBreakable = -1;
    const int max = 79 - (indentation.size() + optionNameMaxWidth + 1);
    int x = 0;
    const qsizetype len = description.size();

    for (qsizetype i = 0; i < len; ++i) {
        ++x;
        const QChar c = description.at(i);
        if (c.isSpace())
            lastBreakable = i;

        qsizetype breakAt = -1;
        qsizetype nextLineStart = -1;
        if (x > max && lastBreakable != -1) {
            // time to break and we know where
            breakAt = lastBreakable;
            nextLineStart = lastBreakable + 1;
        } else if ((x > max - 1 && lastBreakable == -1) || i == len - 1) {
            // time to break but found nowhere [-> break here], or end of last line
            breakAt = i + 1;
            nextLineStart = breakAt;
        } else if (c == nl) {
            // forced break
            breakAt = i;
            nextLineStart = i + 1;
        }

        if (breakAt != -1) {
            const qsizetype numChars = breakAt - lineStart;
            //qDebug() << "breakAt=" << description.at(breakAt) << "breakAtSpace=" << breakAtSpace << lineStart << "to" << breakAt << description.mid(lineStart, numChars);
            text += indentation + nextNameSection().leftJustified(optionNameMaxWidth) + u' ';
            text += QStringView{description}.mid(lineStart, numChars) + nl;
            x = 0;
            lastBreakable = -1;
            lineStart = nextLineStart;
            if (lineStart < len && description.at(lineStart).isSpace())
                ++lineStart; // don't start a line with a space
            i = lineStart;
        }
    }

    while (nameIndex < names.size()) {
        text += indentation + nextNameSection() + nl;
    }

    return text;
}